

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

int opengv::absolute_pose::modules::gpnp2::init(EVP_PKEY_CTX *ctx)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  CoeffReturnType pdVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  RealScalar RVar4;
  DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *this_00;
  RealScalar RVar5;
  RealScalar RVar6;
  RealScalar RVar7;
  RealScalar RVar8;
  RealScalar RVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  double c13w;
  double c12w;
  double c03w;
  double c02w;
  double c01w;
  Vector3d temp;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffede8;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffedf0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffee10;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffee18;
  Scalar SVar618;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_stack_ffffffffffffedf0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffede8);
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_ffffffffffffede8);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  dVar16 = (double)this * RVar4;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (in_stack_ffffffffffffedf0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)
            Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  dVar17 = (double)this_00 * RVar4;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar9 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e7ef6);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e7f1e);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e7f3e);
  dVar11 = *pSVar1 * 2.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e7f66);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar618;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = dVar10 * -2.0;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = -(dVar11 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar18,auVar218,auVar418);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e7fb4);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e7fdc);
  auVar419._8_8_ = 0;
  auVar419._0_8_ = auVar18._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pSVar1;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar19,auVar219,auVar419);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8022);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e805d);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8098);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e80d3);
  dVar13 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e810e);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8149);
  dVar15 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e8185);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar12 + dVar13 + dVar14 + dVar15;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e81a6);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e81cf);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e81f0);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e821b);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar618;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = dVar10 * 2.0;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar20,auVar220,auVar420);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8273);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e829e);
  auVar421._8_8_ = 0;
  auVar421._0_8_ = auVar18._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar1;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar21,auVar221,auVar421);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e82ef);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e831a);
  auVar422._8_8_ = 0;
  auVar422._0_8_ = auVar18._0_8_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = dVar10 * 2.0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar22,auVar222,auVar422);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8354);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e837f);
  auVar423._8_8_ = 0;
  auVar423._0_8_ = auVar18._0_8_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = dVar10 * 2.0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar23,auVar223,auVar423);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e83b9);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e83e4);
  auVar424._8_8_ = 0;
  auVar424._0_8_ = auVar18._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar1;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar24,auVar224,auVar424);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8435);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8460);
  auVar425._8_8_ = 0;
  auVar425._0_8_ = auVar18._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar1;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar25,auVar225,auVar425);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e84b1);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e84dc);
  auVar426._8_8_ = 0;
  auVar426._0_8_ = auVar18._0_8_;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = dVar10 * 2.0;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar26,auVar226,auVar426);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8516);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8541);
  auVar427._8_8_ = 0;
  auVar427._0_8_ = auVar18._0_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = dVar10 * 2.0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar27,auVar227,auVar427);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e857b);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e85a6);
  auVar428._8_8_ = 0;
  auVar428._0_8_ = auVar18._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pSVar1;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar28,auVar228,auVar428);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e85f7);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8622);
  auVar429._8_8_ = 0;
  auVar429._0_8_ = auVar18._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pSVar1;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar29,auVar229,auVar429);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8673);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e869e);
  auVar430._8_8_ = 0;
  auVar430._0_8_ = auVar18._0_8_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = dVar10 * 2.0;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar30,auVar230,auVar430);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e86d8);
  *pSVar2 = auVar18._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e86f9);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8724);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8747);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8772);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar618;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = dVar10 * -2.0;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar31,auVar231,auVar431);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e87cc);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e87f7);
  auVar432._8_8_ = 0;
  auVar432._0_8_ = auVar18._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar1;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar32,auVar232,auVar432);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8846);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8887);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e88c8);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8909);
  dVar13 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e894a);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e898b);
  dVar15 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e89cc);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar12 + dVar13 + dVar14 + dVar15;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e89ed);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8a16);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8a37);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8a62);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SVar618;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar10 * 2.0;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar33,auVar233,auVar433);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8aba);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8ae5);
  auVar434._8_8_ = 0;
  auVar434._0_8_ = auVar18._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pdVar3;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar34,auVar234,auVar434);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8b36);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8b61);
  auVar435._8_8_ = 0;
  auVar435._0_8_ = auVar18._0_8_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar10 * 2.0;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar35,auVar235,auVar435);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8b9b);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8bc6);
  auVar436._8_8_ = 0;
  auVar436._0_8_ = auVar18._0_8_;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar10 * 2.0;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar36,auVar236,auVar436);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8c00);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8c2b);
  auVar437._8_8_ = 0;
  auVar437._0_8_ = auVar18._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar1;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar37,auVar237,auVar437);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8c7c);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8ca7);
  auVar438._8_8_ = 0;
  auVar438._0_8_ = auVar18._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pdVar3;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar38,auVar238,auVar438);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8cf8);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8d23);
  auVar439._8_8_ = 0;
  auVar439._0_8_ = auVar18._0_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar10 * 2.0;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar39,auVar239,auVar439);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8d5d);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8d88);
  auVar440._8_8_ = 0;
  auVar440._0_8_ = auVar18._0_8_;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar10 * 2.0;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar40,auVar240,auVar440);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8dc2);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8ded);
  auVar441._8_8_ = 0;
  auVar441._0_8_ = auVar18._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *pSVar1;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar41,auVar241,auVar441);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8e3e);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8e69);
  auVar442._8_8_ = 0;
  auVar442._0_8_ = auVar18._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *pdVar3;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar42,auVar242,auVar442);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8eba);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8ee5);
  auVar443._8_8_ = 0;
  auVar443._0_8_ = auVar18._0_8_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar10 * 2.0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar43,auVar243,auVar443);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e8f1f);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8f40);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8f69);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e8f8a);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e8fb5);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = SVar618;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar10 * 2.0;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar44,auVar244,auVar444);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e900d);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9038);
  auVar445._8_8_ = 0;
  auVar445._0_8_ = auVar18._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pdVar3;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar45,auVar245,auVar445);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9089);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e90b4);
  auVar446._8_8_ = 0;
  auVar446._0_8_ = auVar18._0_8_;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar10 * 2.0;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar46,auVar246,auVar446);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e90ee);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9119);
  auVar447._8_8_ = 0;
  auVar447._0_8_ = auVar18._0_8_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar10 * 2.0;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar47,auVar247,auVar447);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9153);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e917e);
  auVar448._8_8_ = 0;
  auVar448._0_8_ = auVar18._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *pSVar1;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar48,auVar248,auVar448);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e91cf);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e91fa);
  auVar449._8_8_ = 0;
  auVar449._0_8_ = auVar18._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pdVar3;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar49,auVar249,auVar449);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e924b);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9276);
  auVar450._8_8_ = 0;
  auVar450._0_8_ = auVar18._0_8_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar10 * 2.0;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar50,auVar250,auVar450);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e92b0);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e92db);
  auVar451._8_8_ = 0;
  auVar451._0_8_ = auVar18._0_8_;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar10 * 2.0;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar51,auVar251,auVar451);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9315);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9340);
  auVar452._8_8_ = 0;
  auVar452._0_8_ = auVar18._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pSVar1;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar52,auVar252,auVar452);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9391);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e93bc);
  auVar453._8_8_ = 0;
  auVar453._0_8_ = auVar18._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *pdVar3;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar53,auVar253,auVar453);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e940d);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9438);
  auVar454._8_8_ = 0;
  auVar454._0_8_ = auVar18._0_8_;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar10 * 2.0;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar54,auVar254,auVar454);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e9472);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e94bc);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e94fb);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9526);
  auVar455._8_8_ = 0;
  auVar455._0_8_ = -dVar16 + dVar11;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *pdVar3;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar55,auVar255,auVar455);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9577);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e95b8);
  dVar16 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e95f9);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9624);
  auVar456._8_8_ = 0;
  auVar456._0_8_ = auVar18._0_8_ + dVar11 + dVar16;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pdVar3;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar56,auVar256,auVar456);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9675);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e96b6);
  dVar16 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e96f7);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9722);
  auVar457._8_8_ = 0;
  auVar457._0_8_ = auVar18._0_8_ + dVar11 + dVar16;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *pdVar3;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar57,auVar257,auVar457);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8e9773);
  dVar10 = pow(*pdVar3,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e97b4);
  *pSVar2 = auVar18._0_8_ + dVar10;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e97d5);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9800);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9823);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e984e);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = SVar618;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar10 * -2.0;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar58,auVar258,auVar458);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e98a8);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e98d3);
  auVar459._8_8_ = 0;
  auVar459._0_8_ = auVar18._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pSVar1;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar59,auVar259,auVar459);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9922);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9963);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e99a4);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e99e5);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9a26);
  dVar13 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9a67);
  dVar14 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e9aa8);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar12 + dVar13 + dVar14;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9ac9);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9af2);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9b15);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9b40);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = SVar618;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar10 * 2.0;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar60,auVar260,auVar460);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9b83);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9bae);
  auVar461._8_8_ = 0;
  auVar461._0_8_ = auVar18._0_8_;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar10 * 2.0;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar61,auVar261,auVar461);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9be6);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9c11);
  auVar462._8_8_ = 0;
  auVar462._0_8_ = auVar18._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pSVar1;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar62,auVar262,auVar462);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9c60);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9c8b);
  auVar463._8_8_ = 0;
  auVar463._0_8_ = auVar18._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *pSVar1;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar63,auVar263,auVar463);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9cdc);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9d07);
  auVar464._8_8_ = 0;
  auVar464._0_8_ = auVar18._0_8_;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar10 * 2.0;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar64,auVar264,auVar464);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9d41);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9d6c);
  auVar465._8_8_ = 0;
  auVar465._0_8_ = auVar18._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *pSVar1;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar65,auVar265,auVar465);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9dbd);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9de8);
  auVar466._8_8_ = 0;
  auVar466._0_8_ = auVar18._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *pSVar1;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar66,auVar266,auVar466);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9e39);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9e64);
  auVar467._8_8_ = 0;
  auVar467._0_8_ = auVar18._0_8_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar10 * 2.0;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar67,auVar267,auVar467);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9e9e);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9ec9);
  auVar468._8_8_ = 0;
  auVar468._0_8_ = auVar18._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *pSVar1;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar68,auVar268,auVar468);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9f1a);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9f45);
  auVar469._8_8_ = 0;
  auVar469._0_8_ = auVar18._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pSVar1;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar69,auVar269,auVar469);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9f96);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8e9fc1);
  auVar470._8_8_ = 0;
  auVar470._0_8_ = auVar18._0_8_;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar10 * 2.0;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar70,auVar270,auVar470);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8e9ffa);
  *pSVar2 = auVar18._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea01b);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea046);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea069);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea094);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = SVar618;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = dVar10 * -2.0;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar71,auVar271,auVar471);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea0ee);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea119);
  auVar472._8_8_ = 0;
  auVar472._0_8_ = auVar18._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *pSVar1;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar72,auVar272,auVar472);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea168);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea1a9);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea1ea);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea22b);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea26c);
  dVar13 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea2ad);
  dVar14 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ea2ef);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar12 + dVar13 + dVar14;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea310);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea339);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea35c);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea387);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = SVar618;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar10 * 2.0;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar73,auVar273,auVar473);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea3ca);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea3f5);
  auVar474._8_8_ = 0;
  auVar474._0_8_ = auVar18._0_8_;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar10 * 2.0;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar74,auVar274,auVar474);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea42d);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea458);
  auVar475._8_8_ = 0;
  auVar475._0_8_ = auVar18._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *pSVar1;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar75,auVar275,auVar475);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea4a7);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea4d2);
  auVar476._8_8_ = 0;
  auVar476._0_8_ = auVar18._0_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *pdVar3;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar76,auVar276,auVar476);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea523);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea54e);
  auVar477._8_8_ = 0;
  auVar477._0_8_ = auVar18._0_8_;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar10 * 2.0;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar77,auVar277,auVar477);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea588);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea5b3);
  auVar478._8_8_ = 0;
  auVar478._0_8_ = auVar18._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pSVar1;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar78,auVar278,auVar478);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea604);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea62f);
  auVar479._8_8_ = 0;
  auVar479._0_8_ = auVar18._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *pdVar3;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar79,auVar279,auVar479);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea680);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea6ab);
  auVar480._8_8_ = 0;
  auVar480._0_8_ = auVar18._0_8_;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar10 * 2.0;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar80,auVar280,auVar480);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea6e5);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea710);
  auVar481._8_8_ = 0;
  auVar481._0_8_ = auVar18._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *pSVar1;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar81,auVar281,auVar481);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea761);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea78c);
  auVar482._8_8_ = 0;
  auVar482._0_8_ = auVar18._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pdVar3;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar82,auVar282,auVar482);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea7dd);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea808);
  auVar483._8_8_ = 0;
  auVar483._0_8_ = auVar18._0_8_;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar10 * 2.0;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar83,auVar283,auVar483);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ea843);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea864);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea88d);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea8b0);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea8db);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = SVar618;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar10 * 2.0;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar84,auVar284,auVar484);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea91e);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea949);
  auVar485._8_8_ = 0;
  auVar485._0_8_ = auVar18._0_8_;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = dVar10 * 2.0;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar85,auVar285,auVar485);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ea981);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea9ac);
  auVar486._8_8_ = 0;
  auVar486._0_8_ = auVar18._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *pSVar1;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar86,auVar286,auVar486);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ea9fb);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaa26);
  auVar487._8_8_ = 0;
  auVar487._0_8_ = auVar18._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *pdVar3;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar87,auVar287,auVar487);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaa77);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eaaa2);
  auVar488._8_8_ = 0;
  auVar488._0_8_ = auVar18._0_8_;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar10 * 2.0;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar88,auVar288,auVar488);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaadc);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eab07);
  auVar489._8_8_ = 0;
  auVar489._0_8_ = auVar18._0_8_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *pSVar1;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar89,auVar289,auVar489);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eab58);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eab83);
  auVar490._8_8_ = 0;
  auVar490._0_8_ = auVar18._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *pdVar3;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar90,auVar290,auVar490);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eabd4);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eabff);
  auVar491._8_8_ = 0;
  auVar491._0_8_ = auVar18._0_8_;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = dVar10 * 2.0;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar91,auVar291,auVar491);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eac39);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eac64);
  auVar492._8_8_ = 0;
  auVar492._0_8_ = auVar18._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *pSVar1;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar92,auVar292,auVar492);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eacb5);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eace0);
  auVar493._8_8_ = 0;
  auVar493._0_8_ = auVar18._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *pdVar3;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar93,auVar293,auVar493);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ead31);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ead5c);
  auVar494._8_8_ = 0;
  auVar494._0_8_ = auVar18._0_8_;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = dVar10 * 2.0;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar94,auVar294,auVar494);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ead97);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eade1);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eae22);
  dVar16 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eae63);
  dVar12 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaea2);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaecd);
  auVar495._8_8_ = 0;
  auVar495._0_8_ = -dVar17 + dVar11 + dVar16 + dVar12;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *pdVar3;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar95,auVar295,auVar495);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaf1e);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaf5f);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eaf8a);
  auVar496._8_8_ = 0;
  auVar496._0_8_ = auVar18._0_8_ + dVar11;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *pdVar3;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar96,auVar296,auVar496);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eafdb);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eb01c);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eb047);
  auVar497._8_8_ = 0;
  auVar497._0_8_ = auVar18._0_8_ + dVar11;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *pdVar3;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar97,auVar297,auVar497);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eb098);
  dVar10 = pow(*pdVar3,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eb0da);
  *pSVar2 = auVar18._0_8_ + dVar10;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb0fb);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb126);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb149);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb174);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = SVar618;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = dVar10 * -2.0;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar98,auVar298,auVar498);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb1ce);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb1f9);
  auVar499._8_8_ = 0;
  auVar499._0_8_ = auVar18._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *pSVar1;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar99,auVar299,auVar499);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb248);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb289);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb2ca);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb30b);
  dVar17 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb34c);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb38d);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eb3ce);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar17 + dVar12 + dVar13;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb3ef);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb418);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb43b);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb466);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = SVar618;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = dVar10 * 2.0;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar100,auVar300,auVar500);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb4a9);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb4d4);
  auVar501._8_8_ = 0;
  auVar501._0_8_ = auVar18._0_8_;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = dVar10 * 2.0;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar101,auVar301,auVar501);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb50c);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb537);
  auVar502._8_8_ = 0;
  auVar502._0_8_ = auVar18._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *pSVar1;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar102,auVar302,auVar502);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb586);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb5b1);
  auVar503._8_8_ = 0;
  auVar503._0_8_ = auVar18._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *pSVar1;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar103,auVar303,auVar503);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb602);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb62d);
  auVar504._8_8_ = 0;
  auVar504._0_8_ = auVar18._0_8_;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar10 * 2.0;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar104,auVar304,auVar504);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb667);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb692);
  auVar505._8_8_ = 0;
  auVar505._0_8_ = auVar18._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *pSVar1;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar105,auVar305,auVar505);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb6e3);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb70e);
  auVar506._8_8_ = 0;
  auVar506._0_8_ = auVar18._0_8_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *pSVar1;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar106,auVar306,auVar506);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb75f);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb78a);
  auVar507._8_8_ = 0;
  auVar507._0_8_ = auVar18._0_8_;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar10 * 2.0;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar107,auVar307,auVar507);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb7c4);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb7ef);
  auVar508._8_8_ = 0;
  auVar508._0_8_ = auVar18._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *pSVar1;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar108,auVar308,auVar508);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb840);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb86b);
  auVar509._8_8_ = 0;
  auVar509._0_8_ = auVar18._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *pSVar1;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar109,auVar309,auVar509);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb8bc);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb8e7);
  auVar510._8_8_ = 0;
  auVar510._0_8_ = auVar18._0_8_;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dVar10 * 2.0;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar110,auVar310,auVar510);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eb922);
  *pSVar2 = auVar18._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb943);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb96e);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb991);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eb9bc);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = SVar618;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = dVar10 * -2.0;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar111,auVar311,auVar511);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eba16);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eba41);
  auVar512._8_8_ = 0;
  auVar512._0_8_ = auVar18._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *pSVar1;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar112,auVar312,auVar512);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eba90);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebad1);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebb12);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebb53);
  dVar17 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebb94);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebbd5);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ebc15);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar17 + dVar12 + dVar13;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebc36);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebc5f);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebc82);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebcad);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = SVar618;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar10 * 2.0;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar113,auVar313,auVar513);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebcf0);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebd1b);
  auVar514._8_8_ = 0;
  auVar514._0_8_ = auVar18._0_8_;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar10 * 2.0;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar114,auVar314,auVar514);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebd53);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebd7e);
  auVar515._8_8_ = 0;
  auVar515._0_8_ = auVar18._0_8_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *pSVar1;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar115,auVar315,auVar515);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebdcd);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebdf8);
  auVar516._8_8_ = 0;
  auVar516._0_8_ = auVar18._0_8_;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *pdVar3;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar116,auVar316,auVar516);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebe49);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebe74);
  auVar517._8_8_ = 0;
  auVar517._0_8_ = auVar18._0_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar10 * 2.0;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar117,auVar317,auVar517);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebeae);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebed9);
  auVar518._8_8_ = 0;
  auVar518._0_8_ = auVar18._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *pSVar1;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar118,auVar318,auVar518);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebf2a);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebf55);
  auVar519._8_8_ = 0;
  auVar519._0_8_ = auVar18._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *pdVar3;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar119,auVar319,auVar519);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ebfa6);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ebfd1);
  auVar520._8_8_ = 0;
  auVar520._0_8_ = auVar18._0_8_;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dVar10 * 2.0;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar120,auVar320,auVar520);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec00b);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec036);
  auVar521._8_8_ = 0;
  auVar521._0_8_ = auVar18._0_8_;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *pSVar1;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar121,auVar321,auVar521);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec087);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec0b2);
  auVar522._8_8_ = 0;
  auVar522._0_8_ = auVar18._0_8_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *pdVar3;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar122,auVar322,auVar522);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec103);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec12e);
  auVar523._8_8_ = 0;
  auVar523._0_8_ = auVar18._0_8_;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar10 * 2.0;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar123,auVar323,auVar523);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ec169);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec18a);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec1b3);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec1d6);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec201);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = SVar618;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar10 * 2.0;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar124,auVar324,auVar524);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec244);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec26f);
  auVar525._8_8_ = 0;
  auVar525._0_8_ = auVar18._0_8_;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dVar10 * 2.0;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar125,auVar325,auVar525);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec2a7);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec2d2);
  auVar526._8_8_ = 0;
  auVar526._0_8_ = auVar18._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *pSVar1;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar126,auVar326,auVar526);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec321);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec34c);
  auVar527._8_8_ = 0;
  auVar527._0_8_ = auVar18._0_8_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *pdVar3;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar127,auVar327,auVar527);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec39d);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec3c8);
  auVar528._8_8_ = 0;
  auVar528._0_8_ = auVar18._0_8_;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar10 * 2.0;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar128,auVar328,auVar528);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec402);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec42d);
  auVar529._8_8_ = 0;
  auVar529._0_8_ = auVar18._0_8_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *pSVar1;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar129,auVar329,auVar529);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec47e);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec4a9);
  auVar530._8_8_ = 0;
  auVar530._0_8_ = auVar18._0_8_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *pdVar3;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar130,auVar330,auVar530);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec4fa);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec525);
  auVar531._8_8_ = 0;
  auVar531._0_8_ = auVar18._0_8_;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar10 * 2.0;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar131,auVar331,auVar531);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec55f);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec58a);
  auVar532._8_8_ = 0;
  auVar532._0_8_ = auVar18._0_8_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *pSVar1;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar132,auVar332,auVar532);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec5db);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec606);
  auVar533._8_8_ = 0;
  auVar533._0_8_ = auVar18._0_8_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *pdVar3;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar133,auVar333,auVar533);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec657);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ec682);
  auVar534._8_8_ = 0;
  auVar534._0_8_ = auVar18._0_8_;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar10 * 2.0;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar134,auVar334,auVar534);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ec6bd);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec707);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec748);
  dVar16 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec789);
  dVar17 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec7c8);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec7f3);
  auVar535._8_8_ = 0;
  auVar535._0_8_ = -(RVar4 * RVar5) + dVar11 + dVar16 + dVar17;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *pdVar3;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar135,auVar335,auVar535);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec844);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec885);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec8b0);
  auVar536._8_8_ = 0;
  auVar536._0_8_ = auVar18._0_8_ + dVar11;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *pdVar3;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar136,auVar336,auVar536);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec901);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec942);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec96d);
  auVar537._8_8_ = 0;
  auVar537._0_8_ = auVar18._0_8_ + dVar11;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *pdVar3;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar137,auVar337,auVar537);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ec9be);
  dVar10 = pow(*pdVar3,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eca00);
  *pSVar2 = auVar18._0_8_ + dVar10;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eca23);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eca4e);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eca71);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eca9c);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = SVar618;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar10 * -2.0;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar138,auVar338,auVar538);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecaf6);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecb21);
  auVar539._8_8_ = 0;
  auVar539._0_8_ = auVar18._0_8_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *pSVar1;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar139,auVar339,auVar539);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecb72);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecbb3);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecbf4);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecc35);
  dVar17 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecc76);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eccb7);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eccf8);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar17 + dVar12 + dVar13;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecd1b);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecd46);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecd69);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecd94);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = SVar618;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar10 * 2.0;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar140,auVar340,auVar540);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecdd7);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ece02);
  auVar541._8_8_ = 0;
  auVar541._0_8_ = auVar18._0_8_;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = dVar10 * 2.0;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar141,auVar341,auVar541);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ece3c);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ece67);
  auVar542._8_8_ = 0;
  auVar542._0_8_ = auVar18._0_8_;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar10 * 2.0;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar142,auVar342,auVar542);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecea1);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ececc);
  auVar543._8_8_ = 0;
  auVar543._0_8_ = auVar18._0_8_;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar10 * 2.0;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar143,auVar343,auVar543);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecf06);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecf31);
  auVar544._8_8_ = 0;
  auVar544._0_8_ = auVar18._0_8_;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar10 * 2.0;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar144,auVar344,auVar544);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecf6b);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecf96);
  auVar545._8_8_ = 0;
  auVar545._0_8_ = auVar18._0_8_;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *pSVar1;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar145,auVar345,auVar545);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ecfe7);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed012);
  auVar546._8_8_ = 0;
  auVar546._0_8_ = auVar18._0_8_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *pSVar1;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar146,auVar346,auVar546);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed063);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed08e);
  auVar547._8_8_ = 0;
  auVar547._0_8_ = auVar18._0_8_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *pSVar1;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar147,auVar347,auVar547);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed0df);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed10a);
  auVar548._8_8_ = 0;
  auVar548._0_8_ = auVar18._0_8_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *pSVar1;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar148,auVar348,auVar548);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed15b);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed186);
  auVar549._8_8_ = 0;
  auVar549._0_8_ = auVar18._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *pSVar1;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar149,auVar349,auVar549);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed1d7);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed202);
  auVar550._8_8_ = 0;
  auVar550._0_8_ = auVar18._0_8_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *pSVar1;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar150,auVar350,auVar550);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ed254);
  *pSVar2 = auVar18._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed277);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed2a2);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed2c5);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed2f0);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = SVar618;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar10 * -2.0;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar151,auVar351,auVar551);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed34a);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed375);
  auVar552._8_8_ = 0;
  auVar552._0_8_ = auVar18._0_8_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *pSVar1;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar152,auVar352,auVar552);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed3c6);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed407);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed448);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed489);
  dVar17 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed4ca);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed50b);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ed54d);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar17 + dVar12 + dVar13;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed570);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed59b);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed5be);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed5e9);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = SVar618;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar10 * 2.0;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar153,auVar353,auVar553);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed62c);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed657);
  auVar554._8_8_ = 0;
  auVar554._0_8_ = auVar18._0_8_;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = dVar10 * 2.0;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar154,auVar354,auVar554);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed691);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed6bc);
  auVar555._8_8_ = 0;
  auVar555._0_8_ = auVar18._0_8_;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar10 * 2.0;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar155,auVar355,auVar555);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed6f6);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed721);
  auVar556._8_8_ = 0;
  auVar556._0_8_ = auVar18._0_8_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar10 * 2.0;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar156,auVar356,auVar556);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed75b);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed786);
  auVar557._8_8_ = 0;
  auVar557._0_8_ = auVar18._0_8_;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = dVar10 * 2.0;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar157,auVar357,auVar557);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed7c0);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed7eb);
  auVar558._8_8_ = 0;
  auVar558._0_8_ = auVar18._0_8_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *pSVar1;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar158,auVar358,auVar558);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed83c);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed867);
  auVar559._8_8_ = 0;
  auVar559._0_8_ = auVar18._0_8_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *pdVar3;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar159,auVar359,auVar559);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed8b8);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed8e3);
  auVar560._8_8_ = 0;
  auVar560._0_8_ = auVar18._0_8_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *pSVar1;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar160,auVar360,auVar560);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed934);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed95f);
  auVar561._8_8_ = 0;
  auVar561._0_8_ = auVar18._0_8_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *pdVar3;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar161,auVar361,auVar561);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ed9b0);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ed9db);
  auVar562._8_8_ = 0;
  auVar562._0_8_ = auVar18._0_8_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *pSVar1;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar162,auVar362,auVar562);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eda2c);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eda57);
  auVar563._8_8_ = 0;
  auVar563._0_8_ = auVar18._0_8_;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *pdVar3;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar163,auVar363,auVar563);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8edaa7);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edaca);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edaf5);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edb18);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edb43);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = SVar618;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar10 * 2.0;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar164,auVar364,auVar564);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edb86);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edbb1);
  auVar565._8_8_ = 0;
  auVar565._0_8_ = auVar18._0_8_;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = dVar10 * 2.0;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar165,auVar365,auVar565);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edbeb);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edc16);
  auVar566._8_8_ = 0;
  auVar566._0_8_ = auVar18._0_8_;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = dVar10 * 2.0;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar166,auVar366,auVar566);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edc50);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edc7b);
  auVar567._8_8_ = 0;
  auVar567._0_8_ = auVar18._0_8_;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar10 * 2.0;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar167,auVar367,auVar567);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edcb5);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edce0);
  auVar568._8_8_ = 0;
  auVar568._0_8_ = auVar18._0_8_;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar10 * 2.0;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar168,auVar368,auVar568);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edd1a);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edd45);
  auVar569._8_8_ = 0;
  auVar569._0_8_ = auVar18._0_8_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *pSVar1;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar169,auVar369,auVar569);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edd96);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eddc1);
  auVar570._8_8_ = 0;
  auVar570._0_8_ = auVar18._0_8_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *pdVar3;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar170,auVar370,auVar570);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ede12);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ede3d);
  auVar571._8_8_ = 0;
  auVar571._0_8_ = auVar18._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *pSVar1;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar171,auVar371,auVar571);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ede8e);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edeb9);
  auVar572._8_8_ = 0;
  auVar572._0_8_ = auVar18._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *pdVar3;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar172,auVar372,auVar572);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edf0a);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edf35);
  auVar573._8_8_ = 0;
  auVar573._0_8_ = auVar18._0_8_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *pSVar1;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar173,auVar373,auVar573);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8edf86);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8edfb1);
  auVar574._8_8_ = 0;
  auVar574._0_8_ = auVar18._0_8_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *pdVar3;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar174,auVar374,auVar574);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ee003);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee04f);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee090);
  dVar16 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee0d1);
  dVar17 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee112);
  dVar12 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee153);
  dVar13 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee194);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee1d5);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee200);
  auVar575._8_8_ = 0;
  auVar575._0_8_ = -(RVar6 * RVar7) + dVar11 + dVar16 + dVar17 + dVar12 + dVar13 + dVar14;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *pdVar3;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar175,auVar375,auVar575);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee251);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee27c);
  auVar576._8_8_ = 0;
  auVar576._0_8_ = auVar18._0_8_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *pdVar3;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar176,auVar376,auVar576);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee2cd);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ee2f8);
  auVar577._8_8_ = 0;
  auVar577._0_8_ = auVar18._0_8_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *pdVar3;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar177,auVar377,auVar577);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ee34a);
  *pSVar2 = auVar18._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee36d);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee398);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee3bb);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee3e6);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = SVar618;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = dVar10 * -2.0;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar178,auVar378,auVar578);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee440);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee46b);
  auVar579._8_8_ = 0;
  auVar579._0_8_ = auVar18._0_8_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *pSVar1;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar179,auVar379,auVar579);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee4bc);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee4fd);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee53e);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee57f);
  dVar17 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee5c0);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee601);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ee642);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar17 + dVar12 + dVar13;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee665);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee690);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee6b3);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee6de);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = SVar618;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = dVar10 * 2.0;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar180,auVar380,auVar580);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee721);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee74c);
  auVar581._8_8_ = 0;
  auVar581._0_8_ = auVar18._0_8_;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar10 * 2.0;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar181,auVar381,auVar581);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee786);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee7b1);
  auVar582._8_8_ = 0;
  auVar582._0_8_ = auVar18._0_8_;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar10 * 2.0;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar182,auVar382,auVar582);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee7eb);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee816);
  auVar583._8_8_ = 0;
  auVar583._0_8_ = auVar18._0_8_;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar10 * 2.0;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar183,auVar383,auVar583);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee850);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee87b);
  auVar584._8_8_ = 0;
  auVar584._0_8_ = auVar18._0_8_;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar10 * 2.0;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar184,auVar384,auVar584);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee8b5);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee8e0);
  auVar585._8_8_ = 0;
  auVar585._0_8_ = auVar18._0_8_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *pSVar1;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar185,auVar385,auVar585);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee931);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee95c);
  auVar586._8_8_ = 0;
  auVar586._0_8_ = auVar18._0_8_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *pSVar1;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar186,auVar386,auVar586);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee9ad);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ee9d8);
  auVar587._8_8_ = 0;
  auVar587._0_8_ = auVar18._0_8_;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *pSVar1;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar187,auVar387,auVar587);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eea29);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eea54);
  auVar588._8_8_ = 0;
  auVar588._0_8_ = auVar18._0_8_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *pSVar1;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar188,auVar388,auVar588);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eeaa5);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eead0);
  auVar589._8_8_ = 0;
  auVar589._0_8_ = auVar18._0_8_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *pSVar1;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar189,auVar389,auVar589);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eeb21);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eeb4c);
  auVar590._8_8_ = 0;
  auVar590._0_8_ = auVar18._0_8_;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *pSVar1;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar190,auVar390,auVar590);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eeb9e);
  *pSVar2 = auVar18._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eebc1);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eebec);
  SVar618 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eec0f);
  dVar11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eec3a);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = SVar618;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = dVar10 * -2.0;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = -(dVar11 * 2.0 * *pSVar1);
  auVar18 = vfmadd213sd_fma(auVar191,auVar391,auVar591);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eec94);
  dVar10 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eecbf);
  auVar592._8_8_ = 0;
  auVar592._0_8_ = auVar18._0_8_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *pSVar1;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar192,auVar392,auVar592);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eed10);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eed51);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eed92);
  dVar16 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eedd3);
  dVar17 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eee14);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eee55);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8eee97);
  *pSVar2 = auVar18._0_8_ + dVar10 + dVar11 + dVar16 + dVar17 + dVar12 + dVar13;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eeeba);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eeee5);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eef08);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eef33);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = SVar618;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dVar10 * 2.0;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar193,auVar393,auVar593);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eef76);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8eefa1);
  auVar594._8_8_ = 0;
  auVar594._0_8_ = auVar18._0_8_;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = dVar10 * 2.0;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar194,auVar394,auVar594);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8eefdb);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef006);
  auVar595._8_8_ = 0;
  auVar595._0_8_ = auVar18._0_8_;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = dVar10 * 2.0;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar195,auVar395,auVar595);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef040);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef06b);
  auVar596._8_8_ = 0;
  auVar596._0_8_ = auVar18._0_8_;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar10 * 2.0;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar196,auVar396,auVar596);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef0a5);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef0d0);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = auVar18._0_8_;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = dVar10 * 2.0;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar197,auVar397,auVar597);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef10a);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef135);
  auVar598._8_8_ = 0;
  auVar598._0_8_ = auVar18._0_8_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *pSVar1;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar198,auVar398,auVar598);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef186);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef1b1);
  auVar599._8_8_ = 0;
  auVar599._0_8_ = auVar18._0_8_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *pdVar3;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar199,auVar399,auVar599);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef202);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef22d);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = auVar18._0_8_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *pSVar1;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar200,auVar400,auVar600);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef27e);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef2a9);
  auVar601._8_8_ = 0;
  auVar601._0_8_ = auVar18._0_8_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *pdVar3;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar201,auVar401,auVar601);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef2fa);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef325);
  auVar602._8_8_ = 0;
  auVar602._0_8_ = auVar18._0_8_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *pSVar1;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar202,auVar402,auVar602);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef376);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef3a1);
  auVar603._8_8_ = 0;
  auVar603._0_8_ = auVar18._0_8_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *pdVar3;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar203,auVar403,auVar603);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ef3f3);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef416);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef441);
  SVar618 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef464);
  dVar11 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef48f);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = SVar618;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar10 * 2.0;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar11 * 2.0 * *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar204,auVar404,auVar604);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef4d2);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef4fd);
  auVar605._8_8_ = 0;
  auVar605._0_8_ = auVar18._0_8_;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = dVar10 * 2.0;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar205,auVar405,auVar605);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef537);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef562);
  auVar606._8_8_ = 0;
  auVar606._0_8_ = auVar18._0_8_;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar10 * 2.0;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar206,auVar406,auVar606);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef59c);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef5c7);
  auVar607._8_8_ = 0;
  auVar607._0_8_ = auVar18._0_8_;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = dVar10 * 2.0;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar207,auVar407,auVar607);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef601);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef62c);
  auVar608._8_8_ = 0;
  auVar608._0_8_ = auVar18._0_8_;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar10 * 2.0;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *pSVar1;
  auVar18 = vfmadd213sd_fma(auVar208,auVar408,auVar608);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef666);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef691);
  auVar609._8_8_ = 0;
  auVar609._0_8_ = auVar18._0_8_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *pSVar1;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar209,auVar409,auVar609);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef6e2);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef70d);
  auVar610._8_8_ = 0;
  auVar610._0_8_ = auVar18._0_8_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *pdVar3;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar210,auVar410,auVar610);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef75e);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef789);
  auVar611._8_8_ = 0;
  auVar611._0_8_ = auVar18._0_8_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *pSVar1;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar211,auVar411,auVar611);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef7da);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef805);
  auVar612._8_8_ = 0;
  auVar612._0_8_ = auVar18._0_8_;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *pdVar3;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar212,auVar412,auVar612);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef856);
  dVar10 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef881);
  auVar613._8_8_ = 0;
  auVar613._0_8_ = auVar18._0_8_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *pSVar1;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar213,auVar413,auVar613);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8ef8d2);
  dVar10 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef8fd);
  auVar614._8_8_ = 0;
  auVar614._0_8_ = auVar18._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *pdVar3;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar214,auVar414,auVar614);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8ef94d);
  *pSVar2 = auVar18._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef999);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8ef9da);
  dVar16 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efa1b);
  dVar17 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efa5c);
  dVar12 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efa9d);
  dVar13 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efade);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efb1f);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efb4a);
  auVar615._8_8_ = 0;
  auVar615._0_8_ = -(RVar8 * RVar9) + dVar11 + dVar16 + dVar17 + dVar12 + dVar13 + dVar14;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *pdVar3;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar215,auVar415,auVar615);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efb9b);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efbc6);
  auVar616._8_8_ = 0;
  auVar616._0_8_ = auVar18._0_8_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *pdVar3;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar216,auVar416,auVar616);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efc17);
  dVar10 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8efc42);
  auVar617._8_8_ = 0;
  auVar617._0_8_ = auVar18._0_8_;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *pdVar3;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = -(dVar10 * 2.0);
  auVar18 = vfmadd213sd_fma(auVar217,auVar417,auVar617);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>,_1> *)this_00,
                      (Index)this,0x8efc94);
  *pSVar2 = auVar18._0_8_;
  return (int)pSVar2;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp2::init(
    Eigen::Matrix<double,10,6> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();
  temp = c1-c3;
  double c13w = temp.norm()*temp.norm();

  groebnerMatrix(0,0) = ((((((((-2*m(0,0)*m(3,0)-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0))+pow(m(0,0),2))+pow(m(3,0),2))+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2));
  groebnerMatrix(0,1) = (((((((((((2*n(0,0)*m(0,0)-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0))-2*m(1,0)*n(4,0))+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0));
  groebnerMatrix(0,2) = ((((((((-2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0))+pow(n(0,0),2))+pow(n(3,0),2))+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2));
  groebnerMatrix(0,3) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,4) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,5) = (((((((((-c01w+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0))+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2));
  groebnerMatrix(1,0) = ((((((((-2*m(0,0)*m(6,0)-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(1,1) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0));
  groebnerMatrix(1,2) = ((((((((-2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(1,3) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(6,0))-2*m(0,0)*a(6,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0));
  groebnerMatrix(1,4) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(6,0))-2*n(0,0)*a(6,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0));
  groebnerMatrix(1,5) = (((((((((-c02w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2));
  groebnerMatrix(2,0) = ((((((((-2*m(0,0)*m(9,0)-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(2,1) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(9,0))-2*m(0,0)*n(9,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0));
  groebnerMatrix(2,2) = ((((((((-2*n(0,0)*n(9,0)-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(2,3) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(9,0))-2*m(0,0)*a(9,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0));
  groebnerMatrix(2,4) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(9,0))-2*n(0,0)*a(9,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0));
  groebnerMatrix(2,5) = (((((((((-c03w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2));
  groebnerMatrix(3,0) = ((((((((-2*m(3,0)*m(6,0)-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0))+pow(m(3,0),2))+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(3,1) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))-2*m(4,0)*n(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0));
  groebnerMatrix(3,2) = ((((((((-2*n(3,0)*n(6,0)-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0))+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(3,3) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*a(3,0)*m(6,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0));
  groebnerMatrix(3,4) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*a(3,0)*n(6,0))-2*n(3,0)*a(6,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0));
  groebnerMatrix(3,5) = (((((((((-c12w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))-2*a(5,0)*a(8,0));
  groebnerMatrix(4,0) = ((((((((-2*m(3,0)*m(9,0)-2*m(4,0)*m(10,0))-2*m(5,0)*m(11,0))+pow(m(3,0),2))+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(4,1) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(9,0)*m(9,0))+2*n(10,0)*m(10,0))+2*n(11,0)*m(11,0))-2*n(3,0)*m(9,0))-2*m(3,0)*n(9,0))-2*n(4,0)*m(10,0))-2*m(4,0)*n(10,0))-2*n(5,0)*m(11,0))-2*m(5,0)*n(11,0));
  groebnerMatrix(4,2) = ((((((((-2*n(3,0)*n(9,0)-2*n(4,0)*n(10,0))-2*n(5,0)*n(11,0))+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(4,3) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(9,0)*m(9,0))+2*a(10,0)*m(10,0))+2*a(11,0)*m(11,0))-2*a(3,0)*m(9,0))-2*m(3,0)*a(9,0))-2*a(4,0)*m(10,0))-2*m(4,0)*a(10,0))-2*a(5,0)*m(11,0))-2*m(5,0)*a(11,0));
  groebnerMatrix(4,4) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(9,0)*n(9,0))+2*a(10,0)*n(10,0))+2*a(11,0)*n(11,0))-2*a(3,0)*n(9,0))-2*n(3,0)*a(9,0))-2*a(4,0)*n(10,0))-2*n(4,0)*a(10,0))-2*a(5,0)*n(11,0))-2*n(5,0)*a(11,0));
  groebnerMatrix(4,5) = (((((((((-c13w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(9,0),2))+pow(a(10,0),2))+pow(a(11,0),2))-2*a(3,0)*a(9,0))-2*a(4,0)*a(10,0))-2*a(5,0)*a(11,0));
}